

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_monte_carlo.cpp
# Opt level: O3

double * triangle01_sample(int n,int *seed)

{
  double *pdVar1;
  double *a;
  long lVar2;
  ulong uVar3;
  double dVar4;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar3 = (long)(n * 2) << 3;
  }
  pdVar1 = (double *)operator_new__(uVar3);
  if (0 < n) {
    uVar3 = 0;
    do {
      a = r8vec_uniform_01_new(3,seed);
      lVar2 = 0;
      do {
        dVar4 = log(a[lVar2]);
        a[lVar2] = -dVar4;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      dVar4 = r8vec_sum(3,a);
      pdVar1[uVar3 * 2] = *a / dVar4;
      pdVar1[uVar3 * 2 + 1] = a[1] / dVar4;
      operator_delete__(a);
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)n);
  }
  return pdVar1;
}

Assistant:

double *triangle01_sample ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE01_SAMPLE samples from the interior of the unit triangle in 2D.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Reuven Rubinstein,
//    Monte Carlo Optimization, Simulation, and Sensitivity
//    of Queueing Networks,
//    Krieger, 1992,
//    ISBN: 0894647644,
//    LC: QA298.R79.
//
//  Parameters:
//
//    Input, int N, the number of points.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double TRIANGLE01_SAMPLE[2*N], the points.
//
{
  double *e;
  double e_sum;
  int i;
  int j;
  const int m = 2;
  double *x;

  x = new double[m*n];

  for ( j = 0; j < n; j++ )
  {
    e = r8vec_uniform_01_new ( m + 1, seed );

    for ( i = 0; i < m + 1; i++ )
    {
      e[i] = - log ( e[i] );
    }

    e_sum = r8vec_sum ( m + 1, e );

    for ( i = 0; i < m; i++ )
    {
      x[i+j*m] = e[i] / e_sum;
    }
    delete [] e;
  }

  return x;
}